

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

int Ifn_NtkParseInt(char *pStr,Ifn_Ntk_t *p)

{
  int *pnObjs;
  uint uVar1;
  int iVar2;
  char *format;
  int iNode;
  char *pFinal;
  
  pnObjs = &p->nObjs;
  iVar2 = Ifn_ManStrCheck(pStr,&p->nInps,pnObjs);
  if (iVar2 != 0) {
    uVar1 = p->nInps;
    if ((int)uVar1 < 0xc) {
      if ((((int)uVar1 < 2) || (*pnObjs <= (int)uVar1)) || (0x15 < *pnObjs)) {
        __assert_fail("p->nInps > 1 && p->nInps < p->nObjs && p->nInps <= IFN_INS && p->nObjs < 2*IFN_INS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                      ,0x124,"int Ifn_NtkParseInt(char *, Ifn_Ntk_t *)");
      }
      iVar2 = Inf_ManOpenSymb(pStr);
      if (iVar2 == 0) {
        format = "The first symbol should be one of the symbols: (, [, <, {.\n";
      }
      else {
        iNode = uVar1;
        iVar2 = Ifn_NtkParseInt_rec(pStr,p,&pFinal,&iNode);
        if (iVar2 == 0) {
          return 0;
        }
        if ((*pFinal == '\0') || (*pFinal == ';')) {
          if (iNode == *pnObjs) {
            return 1;
          }
          format = "Mismatch in the number of nodes.\n";
        }
        else {
          format = "The last symbol should be \';\'.\n";
        }
      }
      Ifn_ErrorMessage(format);
    }
    else {
      Ifn_ErrorMessage("The number of variables (%d) exceeds predefined limit (%d). Recompile with different value of IFN_INS.\n"
                       ,(ulong)uVar1,0xb);
    }
  }
  return 0;
}

Assistant:

int Ifn_NtkParseInt( char * pStr, Ifn_Ntk_t * p )
{
    char * pFinal; int iNode;
    if ( !Ifn_ManStrCheck(pStr, &p->nInps, &p->nObjs) )
        return 0;
    if ( p->nInps > IFN_INS )
        return Ifn_ErrorMessage( "The number of variables (%d) exceeds predefined limit (%d). Recompile with different value of IFN_INS.\n", p->nInps, IFN_INS );
    assert( p->nInps > 1 && p->nInps < p->nObjs && p->nInps <= IFN_INS && p->nObjs < 2*IFN_INS );
    if ( !Inf_ManOpenSymb(pStr) )
        return Ifn_ErrorMessage( "The first symbol should be one of the symbols: (, [, <, {.\n" );
    iNode = p->nInps;
    if ( !Ifn_NtkParseInt_rec( pStr, p, &pFinal, &iNode ) )
        return 0;
    if ( pFinal[0] && pFinal[0] != ';' )
        return Ifn_ErrorMessage( "The last symbol should be \';\'.\n" );
    if ( iNode != p->nObjs )
        return Ifn_ErrorMessage( "Mismatch in the number of nodes.\n" );
    return 1;
}